

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O3

size_t __thiscall Board::hash(Board *this)

{
  size_t sVar1;
  long lVar2;
  long lVar3;
  
  sVar1 = 0;
  lVar2 = 0;
  do {
    lVar2 = lVar2 + 3;
    lVar3 = 0;
    do {
      sVar1 = ((long)this->board[0][lVar3] + sVar1 * 10) - 0x30;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    this = (Board *)(this->board + 1);
  } while (lVar2 != 9);
  return sVar1;
}

Assistant:

size_t Board::hash() const {
    size_t key = 0;

    for (const Board::Row& row : board) {
        for (char tile : row) {
            key = key * 10 + (tile - '0');
        }
    }

    return key;
}